

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerSettings.cpp
# Opt level: O1

void __thiscall SerialAnalyzerSettings::LoadSettings(SerialAnalyzerSettings *this,char *settings)

{
  char cVar1;
  int iVar2;
  bool use_autobaud;
  SimpleArchive text_archive;
  Mode mode;
  char *name_string;
  bool local_31;
  SimpleArchive local_30 [12];
  Mode local_24;
  char *local_20;
  
  SimpleArchive::SimpleArchive(local_30);
  SimpleArchive::SetString((char *)local_30);
  SimpleArchive::operator>>(local_30,&local_20);
  iVar2 = strcmp(local_20,"SaleaeAsyncSerialAnalyzer");
  if (iVar2 != 0) {
    AnalyzerHelpers::Assert
              (
              "SaleaeAsyncSerialAnalyzer: Provided with a settings string that doesn\'t belong to us;"
              );
  }
  SimpleArchive::operator>>(local_30,&this->mInputChannel);
  SimpleArchive::operator>>(local_30,&this->mBitRate);
  SimpleArchive::operator>>(local_30,&this->mBitsPerTransfer);
  SimpleArchive::operator>>(local_30,&this->mStopBits);
  SimpleArchive::operator>>(local_30,&this->mParity);
  SimpleArchive::operator>>(local_30,&this->mShiftOrder);
  SimpleArchive::operator>>(local_30,&this->mInverted);
  cVar1 = SimpleArchive::operator>>(local_30,&local_31);
  if (cVar1 != '\0') {
    this->mUseAutobaud = local_31;
  }
  cVar1 = SimpleArchive::operator>>(local_30,&local_24);
  if (cVar1 != '\0') {
    this->mSerialMode = local_24;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_30);
  return;
}

Assistant:

void SerialAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeAsyncSerialAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeAsyncSerialAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> mBitsPerTransfer;
    text_archive >> mStopBits;
    text_archive >> *( U32* )&mParity;
    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> mInverted;

    // check to make sure loading it actually works before assigning the result
    // do this when adding settings to an analyzer which has been previously released.
    bool use_autobaud;
    if( text_archive >> use_autobaud )
        mUseAutobaud = use_autobaud;

    SerialAnalyzerEnums::Mode mode;
    if( text_archive >> *( U32* )&mode )
        mSerialMode = mode;

    ClearChannels();
    AddChannel( mInputChannel, "Serial", true );

    UpdateInterfacesFromSettings();
}